

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O1

void __thiscall
de::Random::choose<unsigned_int_const*,unsigned_int*>
          (Random *this,uint *first,uint *last,uint *result,int numItems)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  
  if (first != last) {
    uVar3 = 0;
    do {
      uVar2 = uVar3;
      if ((int)uVar3 < numItems) {
LAB_00469e42:
        result[(int)uVar2] = *first;
      }
      else {
        dVar1 = deRandom_getUint32(&this->m_rnd);
        uVar2 = dVar1 % (uVar3 + 1);
        if ((int)uVar2 < numItems) goto LAB_00469e42;
      }
      first = first + 1;
      uVar3 = uVar3 + 1;
    } while (first != last);
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}